

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O1

result __thiscall
fmt::v6::internal::fixed_handler::on_digit
          (fixed_handler *this,char digit,uint64_t divisor,uint64_t remainder,uint64_t error,
          int param_5,bool integral)

{
  int iVar1;
  bool bVar2;
  result rVar3;
  long lVar4;
  
  iVar1 = this->size;
  this->size = iVar1 + 1;
  this->buf[iVar1] = digit;
  if (this->size < this->precision) {
    return more;
  }
  if ((!integral) && (divisor - error <= error || divisor <= error)) {
    return error;
  }
  if ((divisor - remainder < remainder) || (divisor + remainder * -2 < error * 2)) {
    if ((error <= remainder) && (divisor - (remainder - error) <= remainder - error)) {
      rVar3 = error;
      bVar2 = true;
      goto LAB_00141caa;
    }
    rVar3 = error;
  }
  else {
    rVar3 = done;
  }
  bVar2 = false;
LAB_00141caa:
  if (bVar2) {
    this->buf[(long)this->size + -1] = this->buf[(long)this->size + -1] + '\x01';
    if (1 < (long)this->size) {
      lVar4 = (long)this->size + 1;
      do {
        if (this->buf[lVar4 + -2] < ':') break;
        this->buf[lVar4 + -2] = '0';
        this->buf[lVar4 + -3] = this->buf[lVar4 + -3] + '\x01';
        lVar4 = lVar4 + -1;
      } while (2 < lVar4);
    }
    rVar3 = done;
    if ('9' < *this->buf) {
      *this->buf = '1';
      iVar1 = this->size;
      this->size = iVar1 + 1;
      this->buf[iVar1] = '0';
    }
  }
  return rVar3;
}

Assistant:

digits::result on_digit(char digit, uint64_t divisor, uint64_t remainder,
                          uint64_t error, int, bool integral) {
    FMT_ASSERT(remainder < divisor, "");
    buf[size++] = digit;
    if (size < precision) return digits::more;
    if (!integral) {
      // Check if error * 2 < divisor with overflow prevention.
      // The check is not needed for the integral part because error = 1
      // and divisor > (1 << 32) there.
      if (error >= divisor || error >= divisor - error) return digits::error;
    } else {
      FMT_ASSERT(error == 1 && divisor > 2, "");
    }
    auto dir = get_round_direction(divisor, remainder, error);
    if (dir != up) return dir == down ? digits::done : digits::error;
    ++buf[size - 1];
    for (int i = size - 1; i > 0 && buf[i] > '9'; --i) {
      buf[i] = '0';
      ++buf[i - 1];
    }
    if (buf[0] > '9') {
      buf[0] = '1';
      buf[size++] = '0';
    }
    return digits::done;
  }